

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

void __thiscall
wasm::ConstantExpressionRunner<wasm::CExpressionRunner>::setLocalValue
          (ConstantExpressionRunner<wasm::CExpressionRunner> *this,Index index,Literals *values)

{
  bool bVar1;
  mapped_type *this_00;
  Literals *values_local;
  ConstantExpressionRunner<wasm::CExpressionRunner> *pCStack_10;
  Index index_local;
  ConstantExpressionRunner<wasm::CExpressionRunner> *this_local;
  
  values_local._4_4_ = index;
  pCStack_10 = this;
  bVar1 = Literals::isConcrete(values);
  if (!bVar1) {
    __assert_fail("values.isConcrete()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-interpreter.h"
                  ,0x80a,
                  "void wasm::ConstantExpressionRunner<wasm::CExpressionRunner>::setLocalValue(Index, Literals &) [SubType = wasm::CExpressionRunner]"
                 );
  }
  this_00 = std::
            unordered_map<unsigned_int,_wasm::Literals,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Literals>_>_>
            ::operator[](&this->localValues,(key_type *)((long)&values_local + 4));
  Literals::operator=(this_00,values);
  return;
}

Assistant:

void setLocalValue(Index index, Literals& values) {
    assert(values.isConcrete());
    localValues[index] = values;
  }